

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.h
# Opt level: O1

void __thiscall
Iir::LayoutBase::addPoleZeroConjugatePairs(LayoutBase *this,complex_t *pole,complex_t *zero)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  PoleZeroPair *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  invalid_argument *this_00;
  
  if ((this->m_numPoles & 1U) == 0) {
    dVar1 = *(double *)pole->_M_value;
    if ((NAN(dVar1)) || (dVar2 = *(double *)(pole->_M_value + 8), NAN(dVar2))) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Pole to add is NaN.");
    }
    else {
      dVar3 = *(double *)zero->_M_value;
      if ((!NAN(dVar3)) && (dVar4 = *(double *)(zero->_M_value + 8), !NAN(dVar4))) {
        uVar6 = *(undefined8 *)zero->_M_value;
        uVar7 = *(undefined8 *)(zero->_M_value + 8);
        pPVar5 = this->m_pair;
        iVar9 = this->m_numPoles >> 1;
        uVar8 = *(undefined8 *)(pole->_M_value + 8);
        *(undefined8 *)pPVar5[iVar9].poles.super_complex_pair_t.first._M_value =
             *(undefined8 *)pole->_M_value;
        *(undefined8 *)(pPVar5[iVar9].poles.super_complex_pair_t.first._M_value + 8) = uVar8;
        *(double *)pPVar5[iVar9].poles.super_complex_pair_t.second._M_value = dVar1;
        *(double *)(pPVar5[iVar9].poles.super_complex_pair_t.second._M_value + 8) = -dVar2;
        *(undefined8 *)pPVar5[iVar9].zeros.super_complex_pair_t.first._M_value = uVar6;
        *(undefined8 *)(pPVar5[iVar9].zeros.super_complex_pair_t.first._M_value + 8) = uVar7;
        *(double *)pPVar5[iVar9].zeros.super_complex_pair_t.second._M_value = dVar3;
        *(double *)(pPVar5[iVar9].zeros.super_complex_pair_t.second._M_value + 8) = -dVar4;
        this->m_numPoles = this->m_numPoles + 2;
        return;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Zero to add is NaN.");
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Can\'t add 2nd order after a 1st order filter.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void addPoleZeroConjugatePairs (const complex_t& pole,
						const complex_t& zero)
		{
			if (m_numPoles&1)
				throw_invalid_argument(errCantAdd2ndOrder);
			if (Iir::is_nan(pole))
				throw_invalid_argument(errPoleisNaN);
			if (Iir::is_nan(zero))
				throw_invalid_argument(errZeroisNaN);
			m_pair[m_numPoles/2] = PoleZeroPair (
				pole, zero, std::conj (pole), std::conj (zero));
			m_numPoles += 2;
		}